

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void heap_insert(heap_t *p,uint entry)

{
  vec_int_t *p_00;
  uint uVar1;
  int iVar2;
  uint local_1c;
  int e;
  uint i;
  uint old_size;
  uint entry_local;
  heap_t *p_local;
  
  uVar1 = vec_int_size(p->indices);
  if (uVar1 < entry + 1) {
    local_1c = vec_int_size(p->indices);
    vec_int_resize(p->indices,entry + 1);
    for (; uVar1 = vec_int_size(p->indices), local_1c < uVar1; local_1c = local_1c + 1) {
      vec_int_at(p->indices,local_1c);
      vec_int_assign(p->indices,local_1c,-1);
    }
  }
  iVar2 = heap_in_heap(p,entry);
  if (iVar2 == 0) {
    p_00 = p->indices;
    uVar1 = vec_uint_size(p->data);
    vec_int_assign(p_00,entry,uVar1);
    vec_uint_push_back(p->data,entry);
    uVar1 = vec_int_at(p->indices,entry);
    heap_percolate_up(p,uVar1);
    return;
  }
  __assert_fail("!heap_in_heap(p, entry)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/heap.h"
                ,0x7f,"void heap_insert(heap_t *, unsigned int)");
}

Assistant:

static inline void heap_insert(heap_t *p, unsigned entry)
{
    if (vec_int_size(p->indices) < entry + 1) {
        unsigned old_size = vec_int_size(p->indices);
        unsigned i;
        int e;
        vec_int_resize(p->indices, entry + 1);
        vec_int_foreach_start(p->indices, e, i, old_size)
            vec_int_assign(p->indices, i, -1);
    }
    assert(!heap_in_heap(p, entry));
    vec_int_assign(p->indices, entry, (int) vec_uint_size(p->data));
    vec_uint_push_back(p->data, entry);
    heap_percolate_up(p, (unsigned) vec_int_at(p->indices, entry));
}